

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool send_shutdown,_Bool *done)

{
  long lVar1;
  SSL *ssl;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint *puVar7;
  undefined7 in_register_00000011;
  char *pcVar8;
  long lVar9;
  _Bool input_pending;
  _Bool *local_450;
  void *local_448;
  undefined4 local_43c;
  char buf [1024];
  
  local_448 = cf->ctx;
  lVar1 = *(long *)((long)local_448 + 0x30);
  ssl = *(SSL **)(lVar1 + 8);
  if ((ssl == (SSL *)0x0) || ((cf->field_0x24 & 2) != 0)) goto LAB_00165b9f;
  *(undefined4 *)((long)local_448 + 0x58) = 0;
  *done = false;
  uVar4 = SSL_get_shutdown(ssl);
  local_450 = done;
  if ((uVar4 & 1) == 0) {
    local_43c = (undefined4)CONCAT71(in_register_00000011,send_shutdown);
    ERR_clear_error();
    uVar6 = 0xffffffffffffffff;
    lVar9 = 0xb;
    do {
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) break;
      uVar4 = SSL_read(*(SSL **)(lVar1 + 8),buf,0x400);
      uVar6 = (ulong)uVar4;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"SSL shutdown not sent, read -> %d",uVar6);
      }
    } while (0 < (int)uVar4);
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),(int)uVar6);
    done = local_450;
    send_shutdown = SUB41(local_43c,0);
    if (((int)uVar6 != 0) || (iVar5 != 6)) goto LAB_00165822;
    if (send_shutdown != false) {
      _Var3 = (*cf->next->cft->is_alive)(cf->next,data,&input_pending);
      if (!_Var3) {
        *(byte *)((long)local_448 + 0x5c) = *(byte *)((long)local_448 + 0x5c) | 2;
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < cf->cft->log_level)) {
          pcVar8 = "peer closed connection";
          goto LAB_00165b92;
        }
        goto LAB_00165b9f;
      }
      uVar6 = 0;
      goto LAB_0016582b;
    }
    if ((((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
        ((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 && (pcVar2->log_level < 1))))
       || (cf->cft->log_level < 1)) goto LAB_00165b9f;
    pcVar8 = "SSL shutdown received, not sending";
LAB_00165b92:
    Curl_trc_cf_infof(data,cf,pcVar8);
    goto LAB_00165b9f;
  }
  uVar6 = 0xffffffffffffffff;
LAB_00165822:
  done = local_450;
  if (send_shutdown == false) {
LAB_001658cc:
    lVar9 = 0xb;
    do {
      uVar4 = (uint)uVar6;
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) break;
      ERR_clear_error();
      uVar4 = SSL_read(*(SSL **)(lVar1 + 8),buf,0x400);
      uVar6 = (ulong)uVar4;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016591f;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016591f:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"SSL shutdown read -> %d",uVar6);
          }
        }
      }
    } while (0 < (int)uVar4);
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),uVar4);
    done = local_450;
    switch(iVar5) {
    case 0:
    case 2:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00165b37;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165b37:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"SSL shutdown sent, want receive");
          }
        }
      }
      *(undefined4 *)((long)local_448 + 0x58) = 1;
      goto LAB_00165ba4;
    default:
      uVar6 = ERR_get_error();
      done = local_450;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00165bfe;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165bfe:
          if (0 < cf->cft->log_level) {
            if (uVar6 == 0) {
              pcVar8 = SSL_ERROR_to_str(iVar5);
            }
            else {
              pcVar8 = ossl_strerror(uVar6,buf,0x400);
            }
            puVar7 = (uint *)__errno_location();
            Curl_trc_cf_infof(data,cf,"SSL shutdown, ignore recv error: \'%s\', errno %d",pcVar8,
                              (ulong)*puVar7);
          }
        }
      }
      break;
    case 3:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00165bce;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165bce:
          if (0 < cf->cft->log_level) {
            pcVar8 = "SSL shutdown send blocked";
LAB_00165bde:
            Curl_trc_cf_infof(data,cf,pcVar8);
          }
        }
      }
      goto LAB_00165beb;
    case 6:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00165b82;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165b82:
          if (0 < cf->cft->log_level) {
            pcVar8 = "SSL shutdown not received, but closed";
            goto LAB_00165b92;
          }
        }
      }
    }
LAB_00165b9f:
    *done = true;
  }
  else {
LAB_0016582b:
    ERR_clear_error();
    iVar5 = SSL_shutdown(*(SSL **)(lVar1 + 8));
    if (iVar5 == 1) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00165b20;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165b20:
          if (0 < cf->cft->log_level) {
            pcVar8 = "SSL shutdown finished";
            goto LAB_00165b92;
          }
        }
      }
      goto LAB_00165b9f;
    }
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),(int)uVar6);
    if (iVar5 != 3) goto LAB_001658cc;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_00165b6b;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00165b6b:
        if (0 < cf->cft->log_level) {
          pcVar8 = "SSL shutdown still wants to send";
          goto LAB_00165bde;
        }
      }
    }
LAB_00165beb:
    *(undefined4 *)((long)local_448 + 0x58) = 2;
  }
LAB_00165ba4:
  cf->field_0x24 = cf->field_0x24 & 0xfd | *done * '\x02';
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_shutdown(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool send_shutdown, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  CURLcode result = CURLE_OK;
  char buf[1024];
  int nread = -1, err;
  unsigned long sslerr;
  size_t i;

  DEBUGASSERT(octx);
  if(!octx->ssl || cf->shutdown) {
    *done = TRUE;
    goto out;
  }

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  *done = FALSE;
  if(!(SSL_get_shutdown(octx->ssl) & SSL_SENT_SHUTDOWN)) {
    /* We have not started the shutdown from our side yet. Check
     * if the server already sent us one. */
    ERR_clear_error();
    for(i = 0; i < 10; ++i) {
      nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
      CURL_TRC_CF(data, cf, "SSL shutdown not sent, read -> %d", nread);
      if(nread <= 0)
        break;
    }
    err = SSL_get_error(octx->ssl, nread);
    if(!nread && err == SSL_ERROR_ZERO_RETURN) {
      bool input_pending;
      /* Yes, it did. */
      if(!send_shutdown) {
        CURL_TRC_CF(data, cf, "SSL shutdown received, not sending");
        *done = TRUE;
        goto out;
      }
      else if(!cf->next->cft->is_alive(cf->next, data, &input_pending)) {
        /* Server closed the connection after its closy notify. It
         * seems not interested to see our close notify, so do not
         * send it. We are done. */
        connssl->peer_closed = TRUE;
        CURL_TRC_CF(data, cf, "peer closed connection");
        *done = TRUE;
        goto out;
      }
    }
  }

  /* SSL should now have started the shutdown from our side. Since it
   * was not complete, we are lacking the close notify from the server. */
  if(send_shutdown) {
    ERR_clear_error();
    if(SSL_shutdown(octx->ssl) == 1) {
      CURL_TRC_CF(data, cf, "SSL shutdown finished");
      *done = TRUE;
      goto out;
    }
    if(SSL_ERROR_WANT_WRITE == SSL_get_error(octx->ssl, nread)) {
      CURL_TRC_CF(data, cf, "SSL shutdown still wants to send");
      connssl->io_need = CURL_SSL_IO_NEED_SEND;
      goto out;
    }
    /* Having sent the close notify, we use SSL_read() to get the
     * missing close notify from the server. */
  }

  for(i = 0; i < 10; ++i) {
    ERR_clear_error();
    nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
    CURL_TRC_CF(data, cf, "SSL shutdown read -> %d", nread);
    if(nread <= 0)
      break;
  }
  err = SSL_get_error(octx->ssl, nread);
  switch(err) {
  case SSL_ERROR_ZERO_RETURN: /* no more data */
    CURL_TRC_CF(data, cf, "SSL shutdown not received, but closed");
    *done = TRUE;
    break;
  case SSL_ERROR_NONE: /* just did not get anything */
  case SSL_ERROR_WANT_READ:
    /* SSL has send its notify and now wants to read the reply
     * from the server. We are not really interested in that. */
    CURL_TRC_CF(data, cf, "SSL shutdown sent, want receive");
    connssl->io_need = CURL_SSL_IO_NEED_RECV;
    break;
  case SSL_ERROR_WANT_WRITE:
    CURL_TRC_CF(data, cf, "SSL shutdown send blocked");
    connssl->io_need = CURL_SSL_IO_NEED_SEND;
    break;
  default:
    /* Server seems to have closed the connection without sending us
     * a close notify. */
    sslerr = ERR_get_error();
    CURL_TRC_CF(data, cf, "SSL shutdown, ignore recv error: '%s', errno %d",
                (sslerr ?
                 ossl_strerror(sslerr, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
    *done = TRUE;
    result = CURLE_OK;
    break;
  }

out:
  cf->shutdown = (result || *done);
  return result;
}